

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t container_size_in_bytes(container_t *c,uint8_t typecode)

{
  uint8_t local_19;
  array_container_t *paStack_18;
  uint8_t typecode_local;
  container_t *c_local;
  
  local_19 = typecode;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_unwrap_shared(c,&local_19);
  if (local_19 == '\x01') {
    c_local._4_4_ = bitset_container_size_in_bytes((bitset_container_t *)paStack_18);
  }
  else if (local_19 == '\x02') {
    c_local._4_4_ = array_container_size_in_bytes(paStack_18);
  }
  else {
    if (local_19 != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x11a5,"int32_t container_size_in_bytes(const container_t *, uint8_t)");
    }
    c_local._4_4_ = run_container_size_in_bytes((run_container_t *)paStack_18);
  }
  return c_local._4_4_;
}

Assistant:

static inline int32_t container_size_in_bytes(
    const container_t *c, uint8_t typecode
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_size_in_bytes(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_size_in_bytes(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_size_in_bytes(const_CAST_run(c));
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}